

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_rkv.c
# Opt level: O0

MPP_RET hal_vp9d_rkv_wait(void *hal,HalTaskInfo *task)

{
  uint uVar1;
  void *pvVar2;
  void *buf;
  DXVA_PicParams_VP9 *pic_param;
  MppFrame mframe;
  uint *puStack_40;
  RK_U32 i;
  RK_U32 *p;
  VP9_REGS *hw_regs;
  Vp9dRkvCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  HalTaskInfo *pHStack_18;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  p_hal._4_4_ = 0;
  hw_regs = *(VP9_REGS **)((long)hal + 0x40);
  p = *(RK_U32 **)(hw_regs->reg_not_use0 + 3);
  if (*(int *)((long)hal + 0x38) != 0) {
    p = *(RK_U32 **)(hw_regs->swreg20_27_vp9_segid_grp + (long)(task->dec).reg_index * 0x10 + -8);
  }
  hw_ctx = (Vp9dRkvCtx *)hal;
  pHStack_18 = task;
  task_local = (HalTaskInfo *)hal;
  if ((p == (RK_U32 *)0x0) &&
     (_mpp_log_l(2,"hal_vp9d_rkv","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
                 "hal_vp9d_rkv_wait",0x252), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  p_hal._4_4_ = mpp_dev_ioctl(hw_ctx->g_buf[0].probe_base,0x10,(void *)0x0);
  if (p_hal._4_4_ != MPP_OK) {
    _mpp_log_l(2,"hal_vp9d_rkv","poll cmd failed %d\n","hal_vp9d_rkv_wait",(ulong)(uint)p_hal._4_4_)
    ;
  }
  if ((hal_vp9d_debug & 4) != 0) {
    puStack_40 = p;
    for (mframe._4_4_ = 0; mframe._4_4_ < 0x4e; mframe._4_4_ = mframe._4_4_ + 1) {
      uVar1 = *puStack_40;
      puStack_40 = puStack_40 + 1;
      _mpp_log_l(4,"hal_vp9d_rkv","get regs[%02d]: %08X\n",(char *)0x0,(ulong)mframe._4_4_,
                 (ulong)uVar1);
    }
  }
  if (((((pHStack_18->dec).flags.val >> 2 & 1) != 0) ||
      (((pHStack_18->dec).flags.val >> 3 & 1) != 0)) || ((p[1] >> 0xc & 1) == 0)) {
    pic_param = (DXVA_PicParams_VP9 *)0x0;
    mpp_buf_slot_get_prop
              (hw_ctx->g_buf[0].count_base,(pHStack_18->dec).output,SLOT_FRAME_PTR,&pic_param);
    mpp_frame_set_errinfo(pic_param,1);
  }
  if ((hw_ctx->g_buf[0].hw_regs != (void *)0x0) && (((pHStack_18->dec).flags.val >> 5 & 1) != 0)) {
    pvVar2 = (pHStack_18->dec).syntax.data;
    mpp_buffer_sync_begin_f
              (*(MppBuffer *)&hw_regs->swreg50_vp9_altrefy_ystride,1,"hal_vp9d_rkv_wait");
    buf = mpp_buffer_get_ptr_with_caller
                    (*(MppBuffer *)&hw_regs->swreg50_vp9_altrefy_ystride,"hal_vp9d_rkv_wait");
    hal_vp9d_update_counts(buf,(pHStack_18->dec).syntax.data);
    mpp_callback_f("hal_vp9d_rkv_wait",(MppCbCtx *)hw_ctx->g_buf[0].hw_regs,
                   (void *)((long)pvVar2 + 0x8c8));
  }
  if (*(int *)&hw_ctx->g_buf[0].rcb_buf != 0) {
    hw_regs->swreg20_27_vp9_segid_grp[(long)(pHStack_18->dec).reg_index * 0x10 + -0x14] =
         (anon_struct_4_9_b2770bda)0x0;
  }
  return p_hal._4_4_;
}

Assistant:

MPP_RET hal_vp9d_rkv_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx *)hal;
    Vp9dRkvCtx *hw_ctx = (Vp9dRkvCtx*)p_hal->hw_ctx;
    VP9_REGS *hw_regs = (VP9_REGS *)hw_ctx->hw_regs;

    if (p_hal->fast_mode)
        hw_regs = (VP9_REGS *)hw_ctx->g_buf[task->dec.reg_index].hw_regs;

    mpp_assert(hw_regs);

    ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    if (hal_vp9d_debug & HAL_VP9D_DBG_REG) {
        RK_U32 *p = (RK_U32 *)hw_regs;
        RK_U32 i = 0;

        for (i = 0; i < sizeof(VP9_REGS) / 4; i++)
            mpp_log("get regs[%02d]: %08X\n", i, *p++);
    }

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err ||
        !hw_regs->swreg1_int.sw_dec_rdy_sta) {
        MppFrame mframe = NULL;
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
        mpp_frame_set_errinfo(mframe, 1);
    }

    if (p_hal->dec_cb && task->dec.flags.wait_done) {
        DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)task->dec.syntax.data;

        mpp_buffer_sync_ro_begin(hw_ctx->count_base);
        hal_vp9d_update_counts(mpp_buffer_get_ptr(hw_ctx->count_base), task->dec.syntax.data);

        mpp_callback(p_hal->dec_cb, &pic_param->counts);
    }
    if (p_hal->fast_mode) {
        hw_ctx->g_buf[task->dec.reg_index].use_flag = 0;
    }

    (void)task;
    return ret;
}